

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

int __thiscall QTreeView::verticalOffset(QTreeView *this)

{
  QTreeViewPrivate *this_00;
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QScrollBar *pQVar5;
  P _a;
  int item;
  
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if ((this_00->super_QAbstractItemViewPrivate).verticalScrollMode == ScrollPerItem) {
    if (this_00->uniformRowHeights == true) {
      pQVar5 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar3 = QAbstractSlider::value(&pQVar5->super_QAbstractSlider);
      iVar3 = iVar3 * this_00->defaultItemHeight;
    }
    else {
      if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
         ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
        QAbstractItemViewPrivate::interruptDelayedItemsLayout
                  (&this_00->super_QAbstractItemViewPrivate);
        (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      lVar1 = (this_00->viewItems).d.size;
      pQVar5 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar2 = QAbstractSlider::value(&pQVar5->super_QAbstractSlider);
      if (lVar1 < iVar2) {
        iVar2 = (int)lVar1;
      }
      if (iVar2 < 1) {
        iVar3 = 0;
      }
      else {
        item = 0;
        iVar3 = 0;
        do {
          iVar4 = QTreeViewPrivate::itemHeight(this_00,item);
          iVar3 = iVar3 + iVar4;
          item = item + 1;
        } while (iVar2 != item);
      }
    }
    return iVar3;
  }
  pQVar5 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
  iVar2 = QAbstractSlider::value(&pQVar5->super_QAbstractSlider);
  return iVar2;
}

Assistant:

int QTreeView::verticalOffset() const
{
    Q_D(const QTreeView);
    if (d->verticalScrollMode == QAbstractItemView::ScrollPerItem) {
        if (d->uniformRowHeights)
            return verticalScrollBar()->value() * d->defaultItemHeight;
        // If we are scrolling per item and have non-uniform row heights,
        // finding the vertical offset in pixels is going to be relatively slow.
        // ### find a faster way to do this
        d->executePostedLayout();
        int offset = 0;
        const int cnt = qMin(d->viewItems.size(), verticalScrollBar()->value());
        for (int i = 0; i < cnt; ++i)
            offset += d->itemHeight(i);
        return offset;
    }
    // scroll per pixel
    return verticalScrollBar()->value();
}